

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O1

void __thiscall Opcode::AABBQuantizedTree::~AABBQuantizedTree(AABBQuantizedTree *this)

{
  AABBQuantizedNode *pAVar1;
  
  (this->super_AABBOptimizedTree)._vptr_AABBOptimizedTree =
       (_func_int **)&PTR__AABBQuantizedTree_0024d378;
  pAVar1 = this->mNodes;
  if (pAVar1 != (AABBQuantizedNode *)0x0) {
    operator_delete__(&pAVar1[-1].mData,pAVar1[-1].mData * 0x18 + 8);
    this->mNodes = (AABBQuantizedNode *)0x0;
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

AABBQuantizedTree::~AABBQuantizedTree()
{
	DELETEARRAY(mNodes);
}